

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase212::run(TestCase212 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  ElementCount EVar6;
  int iVar7;
  undefined4 uVar8;
  long lVar9;
  SegmentBuilder *__s2;
  SegmentBuilder *__s1;
  ElementCount index;
  char *ptrCopy;
  bool bVar10;
  Reader RVar11;
  Reader RVar12;
  StructSchema schema;
  Builder field;
  Builder root;
  Builder fields;
  Builder type;
  SchemaLoader loader;
  MallocMessageBuilder schemaBuilder;
  Schema local_260;
  StructBuilder local_258;
  Reader local_228;
  StructReader local_1f8;
  SegmentBuilder *local_1c0;
  StructBuilder local_1b8;
  PointerBuilder local_190;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  SchemaLoader local_148;
  MallocMessageBuilder local_120;
  
  local_1b8.capTable = (CapTableBuilder *)local_1b8.segment;
  SchemaLoader::SchemaLoader(&local_148);
  SchemaLoader::loadNative(&local_148,(RawSchema *)schemas::s_8ed75a7469f04ce3);
  local_158 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  uStack_150 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  local_120.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)SchemaLoader::get(&local_148,0x8ed75a7469f04ce3,brand,(Schema)0x649c50);
  local_260.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&local_120);
  local_1c0 = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  local_1b8.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  Schema::getProto((Reader *)&local_120,(Schema *)&local_1b8);
  kj::str<capnp::schema::Node::Reader>((String *)&local_228,(Reader *)&local_120);
  Schema::getProto((Reader *)&local_1f8,&local_260);
  kj::str<capnp::schema::Node::Reader>((String *)&local_258,(Reader *)&local_1f8);
  pCVar3 = local_258.capTable;
  pSVar2 = local_258.segment;
  lVar9 = (long)&(local_228._reader.capTable)->_vptr_CapTableReader +
          (ulong)(local_228._reader.capTable == (CapTableReader *)0x0);
  bVar10 = true;
  if (lVar9 == (long)&((local_258.capTable)->super_CapTableReader)._vptr_CapTableReader +
               (ulong)(local_258.capTable == (CapTableBuilder *)0x0)) {
    __s2 = local_258.segment;
    if (local_258.capTable == (CapTableBuilder *)0x0) {
      __s2 = (SegmentBuilder *)0x515344;
    }
    __s1 = (SegmentBuilder *)0x515344;
    if (local_228._reader.capTable != (CapTableReader *)0x0) {
      __s1 = (SegmentBuilder *)local_228._reader.segment;
    }
    iVar7 = bcmp(__s1,__s2,lVar9 - 1);
    bVar10 = iVar7 != 0;
  }
  if (pSVar2 != (SegmentBuilder *)0x0) {
    local_258._0_16_ = ZEXT816(0);
    (**(code **)*local_258.data)(local_258.data,pSVar2,1,pCVar3,pCVar3,0);
  }
  pCVar5 = local_228._reader.capTable;
  pSVar4 = local_228._reader.segment;
  if ((SegmentBuilder *)local_228._reader.segment != (SegmentBuilder *)0x0) {
    local_228._reader.segment = (SegmentReader *)0x0;
    local_228._reader.capTable = (CapTableReader *)0x0;
    (**(code **)*local_228._reader.data)(local_228._reader.data,pSVar4,1,pCVar5,pCVar5,0);
  }
  if ((bool)(bVar10 & kj::_::Debug::minSeverity < 3)) {
    local_1b8.segment = local_1c0;
    Schema::getProto((Reader *)&local_120,(Schema *)&local_1b8);
    kj::str<capnp::schema::Node::Reader>((String *)&local_228,(Reader *)&local_120);
    Schema::getProto((Reader *)&local_1f8,&local_260);
    kj::str<capnp::schema::Node::Reader>((String *)&local_258,(Reader *)&local_1f8);
    kj::_::Debug::log<char_const(&)[108],kj::String,kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"(kj::str(Schema::from<test::TestNewVersion>().getProto())) == (kj::str(schema.getProto()))\", kj::str(Schema::from<test::TestNewVersion>().getProto()), kj::str(schema.getProto())"
               ,(char (*) [108])
                "failed: expected (kj::str(Schema::from<test::TestNewVersion>().getProto())) == (kj::str(schema.getProto()))"
               ,(String *)&local_228,(String *)&local_258);
    pSVar2 = local_258.segment;
    if (local_258.segment != (SegmentBuilder *)0x0) {
      pCVar3 = local_258.capTable;
      local_258._0_16_ = ZEXT816(0);
      (**(code **)*local_258.data)(local_258.data,pSVar2,1,pCVar3,pCVar3,0);
    }
    pCVar5 = local_228._reader.capTable;
    pSVar4 = local_228._reader.segment;
    if ((SegmentBuilder *)local_228._reader.segment != (SegmentBuilder *)0x0) {
      local_228._reader.segment = (SegmentReader *)0x0;
      local_228._reader.capTable = (CapTableReader *)0x0;
      (**(code **)*local_228._reader.data)(local_228._reader.data,pSVar4,1,pCVar5,pCVar5,0);
    }
  }
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  local_190.segment = (SegmentBuilder *)(schemas::s_95b30dd14e01dda8 + 0x48);
  Schema::getProto(&local_228,(Schema *)&local_190);
  MessageBuilder::getRootInternal((Builder *)&local_1b8,&local_120.super_MessageBuilder);
  local_1f8.pointers =
       (WirePointer *)CONCAT44(local_228._reader.pointers._4_4_,(int)local_228._reader.pointers);
  local_1f8.dataSize = local_228._reader.dataSize;
  local_1f8.pointerCount = local_228._reader.pointerCount;
  local_1f8._38_2_ = local_228._reader._38_2_;
  local_1f8.nestingLimit = local_228._reader.nestingLimit;
  local_1f8._44_4_ = local_228._reader._44_4_;
  local_1f8.data = local_228._reader.data;
  local_1f8.segment = local_228._reader.segment;
  local_1f8.capTable = local_228._reader.capTable;
  local_258.data = local_1b8.data;
  local_258.segment = local_1b8.segment;
  local_258.capTable = local_1b8.capTable;
  PointerBuilder::setStruct((PointerBuilder *)&local_258,&local_1f8,false);
  MessageBuilder::getRootInternal((Builder *)&local_258,&local_120.super_MessageBuilder);
  local_1f8.data = local_258.data;
  local_1f8.segment = &(local_258.segment)->super_SegmentReader;
  local_1f8.capTable = &(local_258.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_228,(PointerBuilder *)&local_1f8,(StructSize)0x60005,
             (word *)0x0);
  *(WirePointer *)local_228._reader.data = (WirePointer)0x8ed75a7469f04ce3;
  if ((((WirePointer *)((long)local_228._reader.data + 8))->field_1).structRef.dataSize.value == 1)
  {
    local_258.data =
         (void *)(CONCAT44(local_228._reader.pointers._4_4_,(int)local_228._reader.pointers) + 0x18)
    ;
    local_258.segment = (SegmentBuilder *)local_228._reader.segment;
    local_258.capTable = (CapTableBuilder *)local_228._reader.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_1f8,(PointerBuilder *)&local_258,(StructSize)0x40003,
               (word *)0x0);
    EVar6 = (ElementCount)local_1f8.pointers;
    if ((ElementCount)local_1f8.pointers != 0) {
      index = 0;
      do {
        ListBuilder::getStructElement(&local_258,(ListBuilder *)&local_1f8,index);
        if (*(short *)&((WirePointer *)((long)local_258.data + 8))->offsetAndKind == 0) {
          local_190.pointer = local_258.pointers + 2;
          local_190.segment = local_258.segment;
          local_190.capTable = local_258.capTable;
          PointerBuilder::getStruct(&local_1b8,&local_190,(StructSize)0x10003,(word *)0x0);
          if ((*local_1b8.data == 0x10) &&
             (*(WirePointer *)((long)local_1b8.data + 8) == (WirePointer)0x95b30dd14e01dda8)) {
            ((WirePointer *)((long)local_1b8.data + 8U))->offsetAndKind = 0x69f04ce3;
            ((WirePointer *)((long)local_1b8.data + 8U))->field_1 =
                 (anon_union_4_5_35ddcec3_for_WirePointer_1)0x8ed75a74;
          }
        }
        index = index + 1;
      } while (EVar6 != index);
    }
  }
  StructBuilder::asReader((StructBuilder *)&local_228);
  SchemaLoader::load(&local_148,(Reader *)&local_1f8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  local_258.segment = local_1c0;
  Schema::getProto((Reader *)&local_120,(Schema *)&local_258);
  local_1f8.capTable = (CapTableReader *)local_120.super_MessageBuilder.arenaSpace[0];
  local_1f8.data = local_120.super_MessageBuilder.arenaSpace[2];
  local_1f8.segment = (SegmentReader *)local_120.super_MessageBuilder._vptr_MessageBuilder;
  uVar8 = local_120.super_MessageBuilder.arenaSpace[4]._0_4_;
  if (local_120.super_MessageBuilder.arenaSpace[3]._4_2_ == 0) {
    local_1f8.capTable = (CapTableReader *)0x0;
    local_1f8.data = (void *)0x0;
    local_1f8.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
    uVar8 = 0x7fffffff;
  }
  local_1f8.pointers = (WirePointer *)CONCAT44(local_1f8.pointers._4_4_,uVar8);
  RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1f8,(void *)0x0,0);
  Schema::getProto((Reader *)&local_1f8,&local_260);
  if (local_1f8.pointerCount == 0) {
    local_228._reader.pointers._0_4_ = 0x7fffffff;
    local_228._reader.capTable = (CapTableReader *)0x0;
    local_228._reader.data = (WirePointer *)0x0;
    local_228._reader.segment = (SegmentReader *)0x0;
  }
  else {
    local_228._reader.capTable = local_1f8.capTable;
    local_228._reader.data = local_1f8.pointers;
    local_228._reader.segment = local_1f8.segment;
    local_228._reader.pointers._0_4_ = local_1f8.nestingLimit;
  }
  RVar12 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
  if (((RVar11.super_StringPtr.content.size_ != RVar12.super_StringPtr.content.size_) ||
      (iVar7 = bcmp(RVar11.super_StringPtr.content.ptr,RVar12.super_StringPtr.content.ptr,
                    RVar11.super_StringPtr.content.size_ - 1), iVar7 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_190.segment = local_1c0;
    Schema::getProto((Reader *)&local_120,(Schema *)&local_190);
    local_1f8.segment = (SegmentReader *)local_120.super_MessageBuilder._vptr_MessageBuilder;
    if (local_120.super_MessageBuilder.arenaSpace[3]._4_2_ == 0) {
      local_120.super_MessageBuilder.arenaSpace[4]._0_4_ = 0x7fffffff;
      local_120.super_MessageBuilder.arenaSpace[0] = (CapTableReader *)0x0;
      local_120.super_MessageBuilder.arenaSpace[2] = (void *)0x0;
      local_1f8.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
    }
    local_1f8.pointers =
         (WirePointer *)
         CONCAT44(local_1f8.pointers._4_4_,local_120.super_MessageBuilder.arenaSpace[4]._0_4_);
    local_1f8.capTable = (CapTableReader *)local_120.super_MessageBuilder.arenaSpace[0];
    local_1f8.data = local_120.super_MessageBuilder.arenaSpace[2];
    local_258._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1f8,(void *)0x0,0);
    Schema::getProto((Reader *)&local_1f8,&local_260);
    if (local_1f8.pointerCount == 0) {
      local_228._reader.pointers._0_4_ = 0x7fffffff;
      local_228._reader.capTable = (CapTableReader *)0x0;
      local_228._reader.data = (WirePointer *)0x0;
      local_228._reader.segment = (SegmentReader *)0x0;
    }
    else {
      local_228._reader.capTable = local_1f8.capTable;
      local_228._reader.data = local_1f8.pointers;
      local_228._reader.segment = local_1f8.segment;
      local_228._reader.pointers._0_4_ = local_1f8.nestingLimit;
    }
    local_1b8._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_228,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[124],capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"(Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())\", Schema::from<test::TestNewVersion>().getProto().getDisplayName(), schema.getProto().getDisplayName()"
               ,(char (*) [124])
                "failed: expected (Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())"
               ,(Reader *)&local_258,(Reader *)&local_1b8);
  }
  Schema::requireUsableAs(&local_260,(RawSchema *)schemas::s_8ed75a7469f04ce3);
  SchemaLoader::~SchemaLoader(&local_148);
  return;
}

Assistant:

TEST(SchemaLoader, Downgrade) {
  SchemaLoader loader;

  loader.loadCompiledTypeAndDependencies<test::TestNewVersion>();

  StructSchema schema = loader.get(typeId<test::TestNewVersion>()).asStruct();

  EXPECT_EQ(kj::str(Schema::from<test::TestNewVersion>().getProto()), kj::str(schema.getProto()));

  loadUnderAlternateTypeId<test::TestOldVersion>(loader, typeId<test::TestNewVersion>());

  // We kept the new version, because the replacement was older.
  EXPECT_EQ(Schema::from<test::TestNewVersion>().getProto().getDisplayName(),
            schema.getProto().getDisplayName());
  schema.requireUsableAs<test::TestNewVersion>();
}